

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmn.c
# Opt level: O0

int jsmn_parse_string(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,size_t num_tokens)

{
  char cVar1;
  uint uVar2;
  jsmntok_t *token_00;
  jsmntok_t *in_RCX;
  ulong in_RDX;
  long in_RSI;
  jsmn_parser *in_RDI;
  size_t in_R8;
  bool bVar3;
  int i;
  char c;
  int start;
  jsmntok_t *token;
  int local_44;
  int local_4;
  
  uVar2 = in_RDI->pos;
  in_RDI->pos = in_RDI->pos + 1;
  while( true ) {
    bVar3 = false;
    if (in_RDI->pos < in_RDX) {
      bVar3 = *(char *)(in_RSI + (ulong)in_RDI->pos) != '\0';
    }
    if (!bVar3) break;
    cVar1 = *(char *)(in_RSI + (ulong)in_RDI->pos);
    if (cVar1 == '\"') {
      if (in_RCX == (jsmntok_t *)0x0) {
        local_4 = 0;
      }
      else {
        token_00 = jsmn_alloc_token(in_RDI,in_RCX,in_R8);
        if (token_00 == (jsmntok_t *)0x0) {
          in_RDI->pos = uVar2;
          local_4 = -1;
        }
        else {
          jsmn_fill_token(token_00,JSMN_STRING,uVar2 + 1,in_RDI->pos);
          local_4 = 0;
        }
      }
      return local_4;
    }
    if ((cVar1 == '\\') && (in_RDI->pos + 1 < in_RDX)) {
      in_RDI->pos = in_RDI->pos + 1;
      switch(*(undefined1 *)(in_RSI + (ulong)in_RDI->pos)) {
      case 0x22:
      case 0x2f:
      case 0x5c:
      case 0x62:
      case 0x66:
      case 0x6e:
      case 0x72:
      case 0x74:
        break;
      default:
        in_RDI->pos = uVar2;
        return -2;
      case 0x75:
        in_RDI->pos = in_RDI->pos + 1;
        local_44 = 0;
        while( true ) {
          bVar3 = false;
          if ((local_44 < 4) && (bVar3 = false, in_RDI->pos < in_RDX)) {
            bVar3 = *(char *)(in_RSI + (ulong)in_RDI->pos) != '\0';
          }
          if (!bVar3) break;
          if ((((*(char *)(in_RSI + (ulong)in_RDI->pos) < '0') ||
               ('9' < *(char *)(in_RSI + (ulong)in_RDI->pos))) &&
              ((*(char *)(in_RSI + (ulong)in_RDI->pos) < 'A' ||
               ('F' < *(char *)(in_RSI + (ulong)in_RDI->pos))))) &&
             ((*(char *)(in_RSI + (ulong)in_RDI->pos) < 'a' ||
              ('f' < *(char *)(in_RSI + (ulong)in_RDI->pos))))) {
            in_RDI->pos = uVar2;
            return -2;
          }
          in_RDI->pos = in_RDI->pos + 1;
          local_44 = local_44 + 1;
        }
        in_RDI->pos = in_RDI->pos - 1;
      }
    }
    in_RDI->pos = in_RDI->pos + 1;
  }
  in_RDI->pos = uVar2;
  return -3;
}

Assistant:

static int jsmn_parse_string(jsmn_parser *parser, const char *js,
		size_t len, jsmntok_t *tokens, size_t num_tokens) {
	jsmntok_t *token;

	int start = parser->pos;

	parser->pos++;

	/* Skip starting quote */
	for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
		char c = js[parser->pos];

		/* Quote: end of string */
		if (c == '\"') {
			if (tokens == NULL) {
				return 0;
			}
			token = jsmn_alloc_token(parser, tokens, num_tokens);
			if (token == NULL) {
				parser->pos = start;
				return JSMN_ERROR_NOMEM;
			}
			jsmn_fill_token(token, JSMN_STRING, start+1, parser->pos);
#ifdef JSMN_PARENT_LINKS
			token->parent = parser->toksuper;
#endif
			return 0;
		}

		/* Backslash: Quoted symbol expected */
		if (c == '\\' && parser->pos + 1 < len) {
			int i;
			parser->pos++;
			switch (js[parser->pos]) {
				/* Allowed escaped symbols */
				case '\"': case '/' : case '\\' : case 'b' :
				case 'f' : case 'r' : case 'n'  : case 't' :
					break;
				/* Allows escaped symbol \uXXXX */
				case 'u':
					parser->pos++;
					for(i = 0; i < 4 && parser->pos < len && js[parser->pos] != '\0'; i++) {
						/* If it isn't a hex character we have an error */
						if(!((js[parser->pos] >= 48 && js[parser->pos] <= 57) || /* 0-9 */
									(js[parser->pos] >= 65 && js[parser->pos] <= 70) || /* A-F */
									(js[parser->pos] >= 97 && js[parser->pos] <= 102))) { /* a-f */
							parser->pos = start;
							return JSMN_ERROR_INVAL;
						}
						parser->pos++;
					}
					parser->pos--;
					break;
				/* Unexpected symbol */
				default:
					parser->pos = start;
					return JSMN_ERROR_INVAL;
			}
		}
	}
	parser->pos = start;
	return JSMN_ERROR_PART;
}